

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O1

bool __thiscall sentencepiece::NBestSentencePieceText::IsInitialized(NBestSentencePieceText *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  
  lVar1 = (long)(this->nbests_).super_RepeatedPtrFieldBase.current_size_;
  do {
    lVar3 = lVar1;
    if (lVar3 < 1) break;
    bVar2 = SentencePieceText::IsInitialized
                      ((SentencePieceText *)
                       ((this->nbests_).super_RepeatedPtrFieldBase.rep_)->elements[lVar3 + -1]);
    lVar1 = lVar3 + -1;
  } while (bVar2);
  return lVar3 < 1;
}

Assistant:

bool NBestSentencePieceText::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(nbests_)) return false;
  return true;
}